

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chvalid.c
# Opt level: O3

int xmlCharInRange(uint val,xmlChRangeGroup *rptr)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (rptr != (xmlChRangeGroup *)0x0) {
    if (val < 0x10000) {
      iVar1 = rptr->nbShortRange;
      if ((iVar1 != 0) && (0 < iVar1)) {
        iVar1 = iVar1 + -1;
        iVar3 = 0;
        do {
          uVar2 = (uint)(iVar3 + iVar1) >> 1;
          if ((int)val < (int)(uint)rptr->shortRange[uVar2].low) {
            iVar1 = uVar2 - 1;
          }
          else {
            if ((ushort)val <= rptr->shortRange[uVar2].high) {
              return 1;
            }
            iVar3 = uVar2 + 1;
          }
        } while (iVar3 <= iVar1);
      }
    }
    else {
      iVar1 = rptr->nbLongRange;
      if ((iVar1 != 0) && (0 < iVar1)) {
        iVar1 = iVar1 + -1;
        iVar3 = 0;
        do {
          uVar2 = (uint)(iVar3 + iVar1) >> 1;
          if (val < rptr->longRange[uVar2].low) {
            iVar1 = uVar2 - 1;
          }
          else {
            if (val <= rptr->longRange[uVar2].high) {
              return 1;
            }
            iVar3 = uVar2 + 1;
          }
        } while (iVar3 <= iVar1);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlCharInRange (unsigned int val, const xmlChRangeGroup *rptr) {
    int low, high, mid;
    const xmlChSRange *sptr;
    const xmlChLRange *lptr;

    if (rptr == NULL) return(0);
    if (val < 0x10000) {	/* is val in 'short' or 'long'  array? */
	if (rptr->nbShortRange == 0)
	    return 0;
	low = 0;
	high = rptr->nbShortRange - 1;
	sptr = rptr->shortRange;
	while (low <= high) {
	    mid = (low + high) / 2;
	    if ((unsigned short) val < sptr[mid].low) {
		high = mid - 1;
	    } else {
	        if ((unsigned short) val > sptr[mid].high) {
		    low = mid + 1;
		} else {
		    return 1;
		}
	    }
	}
    } else {
	if (rptr->nbLongRange == 0) {
	    return 0;
	}
	low = 0;
	high = rptr->nbLongRange - 1;
	lptr = rptr->longRange;
	while (low <= high) {
	    mid = (low + high) / 2;
	    if (val < lptr[mid].low) {
		high = mid - 1;
	    } else {
	        if (val > lptr[mid].high) {
		    low = mid + 1;
		} else {
		    return 1;
		}
	    }
	}
    }
    return 0;
}